

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

void ctemplate::AssertExpandWithDataIs
               (Template *tpl,TemplateDictionary *dict,PerExpandData *per_expand_data,string *is,
               bool expected)

{
  __type _Var1;
  int iVar2;
  char *pcVar3;
  char *__s2;
  undefined8 uVar4;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  char *local_38;
  char *buf;
  string *psStack_28;
  bool expected_local;
  string *is_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionary *dict_local;
  Template *tpl_local;
  
  buf._7_1_ = expected;
  psStack_28 = is;
  is_local = (string *)per_expand_data;
  per_expand_data_local = (PerExpandData *)dict;
  dict_local = (TemplateDictionary *)tpl;
  pcVar3 = ExpandIs(tpl,dict,per_expand_data,expected);
  local_38 = pcVar3;
  __s2 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar3,__s2);
  if (iVar2 != 0) {
    uVar4 = std::__cxx11::string::c_str();
    printf("expected = \'%s\'\n",uVar4);
    printf("actual   = \'%s\'\n",local_38);
  }
  pcVar3 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar3,&local_59);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,psStack_28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (((_Var1 ^ 0xffU) & 1) == 0) {
    if (local_38 != (char *)0x0) {
      operator_delete__(local_38);
    }
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xcb,"string(buf) == is");
  pcVar3 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar3,&local_91);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,psStack_28);
  if (!_Var1) {
    __assert_fail("string(buf) == is",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                  ,0xcb,
                  "void ctemplate::AssertExpandWithDataIs(const Template *, const TemplateDictionary *, PerExpandData *, const string &, bool)"
                 );
  }
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  exit(1);
}

Assistant:

void AssertExpandWithDataIs(const Template* tpl,
                            const TemplateDictionary *dict,
                            PerExpandData* per_expand_data,
                            const string& is, bool expected) {
  const char* buf = ExpandIs(tpl, dict, per_expand_data, expected);
  if (strcmp(buf, is.c_str())) {
    printf("expected = '%s'\n", is.c_str());
    printf("actual   = '%s'\n", buf);
  }
  ASSERT(string(buf) == is);
  delete [] buf;
}